

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GestDsk.cpp
# Opt level: O1

string * __thiscall DSK::ReadDskDir_abi_cxx11_(string *__return_storage_ptr__,DSK *this)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  byte *pbVar5;
  uint uVar6;
  int i;
  long lVar7;
  char Nom [13];
  ostringstream c;
  StDirEntry TabDir [64];
  undefined8 local_9e8;
  undefined1 local_9e0;
  undefined2 local_9df;
  undefined1 local_9dd;
  undefined1 local_9dc;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_9d8;
  long *local_9d0;
  long local_9c0 [2];
  ostringstream local_9b0 [112];
  ios_base local_940 [264];
  byte local_838;
  undefined1 auStack_837 [8];
  undefined2 uStack_82f;
  char acStack_82d [5];
  undefined8 local_828 [255];
  
  local_9d8 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_9d8;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pbVar5 = &local_838;
  lVar7 = 0;
  do {
    GetInfoDirEntry(this,(int)lVar7);
    pbVar5[0] = GetInfoDirEntry::Dir.User;
    pbVar5[1] = GetInfoDirEntry::Dir.Nom[0];
    pbVar5[2] = GetInfoDirEntry::Dir.Nom[1];
    pbVar5[3] = GetInfoDirEntry::Dir.Nom[2];
    pbVar5[4] = GetInfoDirEntry::Dir.Nom[3];
    pbVar5[5] = GetInfoDirEntry::Dir.Nom[4];
    pbVar5[6] = GetInfoDirEntry::Dir.Nom[5];
    pbVar5[7] = GetInfoDirEntry::Dir.Nom[6];
    pbVar5[8] = GetInfoDirEntry::Dir.Nom[7];
    pbVar5[9] = GetInfoDirEntry::Dir.Ext[0];
    pbVar5[10] = GetInfoDirEntry::Dir.Ext[1];
    pbVar5[0xb] = GetInfoDirEntry::Dir.Ext[2];
    pbVar5[0xc] = GetInfoDirEntry::Dir.NumPage;
    pbVar5[0xd] = GetInfoDirEntry::Dir.Unused[0];
    pbVar5[0xe] = GetInfoDirEntry::Dir.Unused[1];
    pbVar5[0xf] = GetInfoDirEntry::Dir.NbPages;
    *(undefined8 *)(pbVar5 + 0x10) = GetInfoDirEntry::Dir.Blocks._0_8_;
    *(undefined8 *)(pbVar5 + 0x18) = GetInfoDirEntry::Dir.Blocks._8_8_;
    lVar7 = lVar7 + 1;
    pbVar5 = pbVar5 + 0x20;
  } while (lVar7 != 0x40);
  lVar7 = 0;
  do {
    lVar3 = lVar7 * 0x20;
    bVar1 = (&local_838)[lVar3];
    if ((bVar1 != 0xe5) && (*(char *)((long)local_828 + lVar3 + -4) == '\0')) {
      local_9e8 = *(undefined8 *)(auStack_837 + lVar3);
      local_9dd = *(undefined1 *)((long)local_828 + lVar3 + -5);
      local_9df = *(undefined2 *)((long)local_828 + lVar3 + -7);
      local_9e0 = 0x2e;
      local_9dc = 0;
      lVar3 = 0;
      do {
        uVar6 = *(byte *)((long)&local_9e8 + lVar3) & 0x7f;
        *(char *)((long)&local_9e8 + lVar3) = (char)uVar6;
        iVar2 = isprint(uVar6);
        uVar4 = 0x3f;
        if (iVar2 != 0) {
          uVar4 = uVar6;
        }
        *(char *)((long)&local_9e8 + lVar3) = (char)uVar4;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0xc);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::ostringstream::ostringstream(local_9b0);
      std::ostream::operator<<((ostream *)local_9b0,(uint)bVar1);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_9d0);
      if (local_9d0 != local_9c0) {
        operator_delete(local_9d0,local_9c0[0] + 1);
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::ostringstream::~ostringstream(local_9b0);
      std::ios_base::~ios_base(local_940);
    }
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x40);
  return __return_storage_ptr__;
}

Assistant:

std::string DSK::ReadDskDir( void ) {
	StDirEntry TabDir[ 64 ];
	string catalogue;
	for ( int i = 0; i < 64; i++ ) {
		memcpy( &TabDir[ i ]
				, GetInfoDirEntry( i )
				, sizeof( StDirEntry )
			  );
	}
	// Trier les fichiers
	for ( int i = 0; i < 64; i++ ) {
		//
		// Afficher les fichiers non effac�s
		//
		if ( TabDir[ i ].User != USER_DELETED && ! TabDir[ i ].NumPage ) {
			char Nom[ 13 ];
			memcpy( Nom, TabDir[ i ].Nom, 8 );
			memcpy( &Nom[ 9 ], TabDir[ i ].Ext, 3 );
			Nom[ 8 ] = '.';
			Nom[ 12 ] = 0;
			//
			// Masquer les bits d'attributs
			//
			for ( int j = 0; j < 12; j++ )
			{
				Nom[ j ] &= 0x7F;

				if ( ! isprint( Nom[ j ] ) ) 
					Nom[ j ] = '?' ;
			}

			catalogue += Nom;
			catalogue += " "; 
			ostringstream c;
			c << (int)TabDir[i].User;
			catalogue += c.str();
			//
			// Calcule la taille du fichier en fonction du nombre de blocs
			//
			int p = 0, t = 0;
			do {
				if ( TabDir[ p + i ].User == TabDir[ i ].User )
					t += TabDir[ p + i ].NbPages;
				p++;
			} while( TabDir[ p + i ].NumPage && ( p + i ) < 64  );
            //string size = GetTaille( ( t + 7 ) >> 3  );
            //catalogue+= " : " + size + "\n";
            catalogue += "\n";

		}
	}
	return catalogue;
}